

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdLoadZero<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,unsigned_int>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  Value value;
  RunResult RVar1;
  long lVar2;
  L val;
  Simd<unsigned_int,_(unsigned_char)__x04_> result;
  
  RVar1 = Load<unsigned_int>(this,instr,&val,out_trap);
  if (RVar1 == Ok) {
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
      *(undefined4 *)((long)result.v + lVar2) = 0;
    }
    result.v[0] = val;
    value.field_0._4_4_ = result.v[1];
    value.field_0._8_4_ = result.v[2];
    value.field_0._12_4_ = result.v[3];
    value.field_0.i32_ = val;
    Push(this,value);
    RVar1 = Ok;
  }
  else {
    RVar1 = Trap;
  }
  return RVar1;
}

Assistant:

RunResult Thread::DoSimdLoadZero(Instr instr, Trap::Ptr* out_trap) {
  using L = typename S::LaneType;
  L val;
  if (Load<L>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  std::fill(std::begin(result.v), std::end(result.v), 0);
  result[0] = val;
  Push(result);
  return RunResult::Ok;
}